

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O3

void __thiscall kpeg::JPEGEncoder::computeDCT(JPEGEncoder *this)

{
  undefined4 uVar1;
  double dVar2;
  double dVar3;
  size_type sVar4;
  string *psVar5;
  Level LVar6;
  uint uVar7;
  Logger *pLVar8;
  ostream *poVar9;
  ulong uVar10;
  Level lvl;
  Level lvl_00;
  Image *this_00;
  long lVar11;
  int c;
  long lVar12;
  long lVar13;
  size_type *psVar14;
  int x;
  ulong uVar15;
  float fVar16;
  float fVar17;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float Cv;
  array<std::array<kpeg::FPixel,_8UL>,_8UL> coefficients;
  ulong local_3c0;
  long *local_3b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3b0;
  ulong local_398;
  long local_390;
  ulong local_388;
  long local_380;
  float local_378 [4];
  undefined8 local_368;
  float fStack_360;
  float fStack_35c;
  ulong local_350;
  string *local_348;
  long local_340;
  ulong local_338;
  string local_330 [24];
  
  pLVar8 = Logger::get();
  LVar6 = Logger::getLevel(pLVar8);
  if (0 < (int)LVar6) {
    pLVar8 = Logger::get();
    poVar9 = Logger::getStream(pLVar8);
    Logger::levelStr_abi_cxx11_(local_330,(Logger *)0x1,lvl);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_330[0]._M_dataplus._M_p,local_330[0]._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"[ kpeg:",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Encoder.cpp",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,":",1);
    *(uint *)(&poVar9->field_0x18 + (long)poVar9->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar9->field_0x18 + (long)poVar9->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x1b4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," ] ",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"Applying Forward DCT on components...",0x25);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330[0]._M_dataplus._M_p != &local_330[0].field_2) {
      operator_delete(local_330[0]._M_dataplus._M_p,local_330[0].field_2._M_allocated_capacity + 1);
    }
  }
  this_00 = &this->m_image;
  uVar7 = Image::getHeight(this_00);
  if (7 < uVar7) {
    local_3c0 = 8;
    local_398 = 0;
    do {
      uVar7 = Image::getWidth(this_00);
      if (7 < uVar7) {
        local_388 = 8;
        local_390 = 0;
        local_350 = 0;
        do {
          memset(local_330,0,0x300);
          lVar13 = 0;
          do {
            local_378[3] = *(float *)(&DAT_00133d30 + (ulong)(lVar13 == 0) * 4);
            local_348 = local_330 + lVar13 * 3;
            local_380 = 0;
            local_340 = lVar13;
            do {
              local_378[2] = 0.0;
              local_378[0] = 0.0;
              local_378[1] = 0.0;
              uVar10 = local_398;
              do {
                local_368 = (size_type *)
                            ((double)(((int)uVar10 * 2 + 1) * (int)lVar13) * 3.141592653589793 *
                            0.0625);
                lVar11 = local_390;
                uVar15 = local_350;
                local_338 = uVar10;
                do {
                  lVar12 = 0;
                  do {
                    Image::getFlPixelPtr(this_00);
                    fVar16 = *(float *)(*(long *)(*local_3b8 + uVar10 * 0x18) + lVar11 + lVar12 * 4)
                    ;
                    dVar2 = cos((double)(((int)uVar15 * 2 + 1) * (int)local_380) * 3.141592653589793
                                * 0.0625);
                    dVar3 = cos((double)local_368);
                    local_378[lVar12] =
                         (float)(dVar3 * dVar2 * (double)fVar16 + (double)local_378[lVar12]);
                    if (local_3b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b0);
                    }
                    lVar13 = local_340;
                    lVar12 = lVar12 + 1;
                  } while (lVar12 != 3);
                  uVar15 = uVar15 + 1;
                  lVar11 = lVar11 + 0xc;
                } while (uVar15 != local_388);
                uVar10 = local_338 + 1;
              } while (uVar10 != local_3c0);
              fVar18 = *(float *)(&DAT_00133d38 + (ulong)(local_380 == 0) * 4) * local_378[3];
              fVar16 = local_378[2] * fVar18;
              local_368._0_4_ = fVar18 * (float)local_378._0_8_ * 100.0;
              local_368._4_4_ = fVar18 * SUB84(local_378._0_8_,4) * 100.0;
              fStack_360 = fVar18 * 0.0 * 0.0;
              fStack_35c = fVar18 * 0.0 * 0.0;
              fVar18 = roundf((float)local_368);
              fVar17 = roundf(local_368._4_4_);
              psVar5 = local_348;
              auVar19._4_4_ = extraout_XMM0_Db;
              auVar19._0_4_ = fVar18;
              auVar19._8_4_ = extraout_XMM0_Db;
              auVar19._12_4_ = extraout_XMM0_Db_00;
              auVar20._8_8_ = auVar19._8_8_;
              auVar20._4_4_ = fVar17;
              auVar20._0_4_ = fVar18;
              auVar20 = divps(auVar20,_DAT_00133d40);
              *(long *)((long)&local_348->_M_dataplus + local_380 * 0xc) = auVar20._0_8_;
              fVar16 = roundf(fVar16 * 100.0);
              *(float *)((long)&psVar5->_M_string_length + local_380 * 0xc) = fVar16 / 100.0;
              local_380 = local_380 + 1;
            } while (local_380 != 8);
            lVar13 = lVar13 + 1;
          } while (lVar13 != 8);
          psVar14 = &local_330[0]._M_string_length;
          uVar10 = local_398;
          do {
            lVar11 = 8;
            lVar13 = local_390;
            local_368 = psVar14;
            do {
              uVar1 = *(undefined4 *)&(((string *)(psVar14 + -1))->_M_dataplus)._M_p;
              Image::getFlPixelPtr(this_00);
              *(undefined4 *)(*(long *)(*local_3b8 + uVar10 * 0x18) + lVar13) = uVar1;
              if (local_3b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b0);
              }
              uVar1 = *(undefined4 *)((long)psVar14 + -4);
              Image::getFlPixelPtr(this_00);
              *(undefined4 *)(*(long *)(*local_3b8 + uVar10 * 0x18) + 4 + lVar13) = uVar1;
              if (local_3b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b0);
              }
              sVar4 = *psVar14;
              Image::getFlPixelPtr(this_00);
              *(int *)(*(long *)(*local_3b8 + uVar10 * 0x18) + 8 + lVar13) = (int)sVar4;
              if (local_3b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b0);
              }
              psVar14 = (size_type *)((long)psVar14 + 0xc);
              lVar13 = lVar13 + 0xc;
              lVar11 = lVar11 + -1;
            } while (lVar11 != 0);
            uVar10 = uVar10 + 1;
            psVar14 = local_368 + 0xc;
          } while (uVar10 != local_3c0);
          uVar10 = local_388 | 7;
          uVar7 = Image::getWidth(this_00);
          local_350 = local_350 + 8;
          local_390 = local_390 + 0x60;
          local_388 = local_388 + 8;
        } while (uVar10 < uVar7);
      }
      uVar10 = local_3c0 | 7;
      uVar7 = Image::getHeight(this_00);
      local_398 = local_398 + 8;
      local_3c0 = local_3c0 + 8;
    } while (uVar10 < uVar7);
  }
  pLVar8 = Logger::get();
  LVar6 = Logger::getLevel(pLVar8);
  if (0 < (int)LVar6) {
    pLVar8 = Logger::get();
    poVar9 = Logger::getStream(pLVar8);
    Logger::levelStr_abi_cxx11_(local_330,(Logger *)0x1,lvl_00);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_330[0]._M_dataplus._M_p,local_330[0]._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"[ kpeg:",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Encoder.cpp",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,":",1);
    *(uint *)(&poVar9->field_0x18 + (long)poVar9->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar9->field_0x18 + (long)poVar9->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x1f2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," ] ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Forward DCT applied [OK]",0x18);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330[0]._M_dataplus._M_p != &local_330[0].field_2) {
      operator_delete(local_330[0]._M_dataplus._M_p,local_330[0].field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void kpeg::JPEGEncoder::computeDCT()
    {
        LOG(Logger::Level::INFO) << "Applying Forward DCT on components..." << std::endl;
        
        // Traverse the pixel pointer, 8x8 blocks at a time
        for ( int iy = 0; iy + 8 - 1 < m_image.getHeight(); iy += 8 )
        {
            for ( int ix = 0; ix + 8 - 1 < m_image.getWidth(); ix += 8 )
            {
                std::array<std::array<FPixel, 8>, 8> coefficients;
                
                for ( int v = 0; v < 8; ++v )
                {
                    for ( int u = 0; u < 8; ++u )
                    {
                        float Cu = u == 0 ? 1.0 / std::sqrt(2.f) : 1.f;
                        float Cv = v == 0 ? 1.0 / std::sqrt(2.f) : 1.f;
                        float coeff[3] = { 0.f, 0.f, 0.f };
                        
                        for ( int y = iy; y < iy + 8; ++y )
                        {
                            for ( int x = ix; x < ix + 8; ++x )
                            {
                                for ( int c = 0; c < 3; ++c )
                                {
                                    coeff[c] += (*m_image.getFlPixelPtr())[y][x].comp[c] *
                                                 std::cos( ( 2 * x + 1 ) * u * M_PI / 16 ) *
                                                  std::cos( ( 2 * y + 1 ) * v * M_PI / 16 );
                                }
                            }
                        }
                        
                        coeff[YCbCrComponents::Y] = 0.25f * Cu * Cv * coeff[0];
                        coeff[YCbCrComponents::Cb] = 0.25f * Cu * Cv * coeff[1];
                        coeff[YCbCrComponents::Cr] = 0.25f * Cu * Cv * coeff[2];
                        
                        coefficients[v][u].comp[YCbCrComponents::Y] = std::roundf( coeff[YCbCrComponents::Y] * 100 ) / 100;
                        coefficients[v][u].comp[YCbCrComponents::Cb] = std::roundf( coeff[YCbCrComponents::Cb] * 100 ) / 100;
                        coefficients[v][u].comp[YCbCrComponents::Cr] = std::roundf( coeff[YCbCrComponents::Cr] * 100 ) / 100;
                    }
                }
                
                for ( int y = iy; y < iy + 8; ++y )
                {
                    for ( int x = ix; x < ix + 8; ++x )
                    {
                        (*m_image.getFlPixelPtr())[y][x].comp[YCbCrComponents::Y] = coefficients[y - iy][x - ix].comp[YCbCrComponents::Y];
                        (*m_image.getFlPixelPtr())[y][x].comp[YCbCrComponents::Cb] = coefficients[y - iy][x - ix].comp[YCbCrComponents::Cb];
                        (*m_image.getFlPixelPtr())[y][x].comp[YCbCrComponents::Cr] = coefficients[y - iy][x - ix].comp[YCbCrComponents::Cr];
                    }
                }
            }
        }
        
//         for ( auto&& row : *m_image.getFlPixelPtr() )
//         {
//             for ( auto&& val : row )
//             {
//                 std::cout << val.comp[0] << "," << val.comp[1] << "," << val.comp[2] << "\t";
//             }
//             std::cout << std::endl;
//         }
//         std::cout << std::endl;
        
        LOG(Logger::Level::INFO) << "Forward DCT applied [OK]" << std::endl;
    }